

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodePreviewDockRender
               (ImGuiWindow *host_window,ImGuiDockNode *host_node,ImGuiWindow *root_payload,
               ImGuiDockPreviewData *data)

{
  float *pfVar1;
  float fVar2;
  ImVec2 IVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  ImGuiContext *pIVar13;
  ImU32 IVar14;
  ImU32 col;
  ImVec2 *pIVar15;
  uint uVar16;
  ImGuiContext *pIVar17;
  char *pcVar18;
  undefined8 extraout_RDX;
  ImGuiWindow *pIVar19;
  ImGuiDockNode *pIVar20;
  ulong uVar21;
  long lVar22;
  int overlay_n;
  long lVar23;
  ImDrawList *pIVar24;
  ImGuiDockPreviewData *pIVar25;
  ImGuiContext *g;
  ImGuiTabBar *pIVar26;
  bool bVar27;
  float fVar28;
  undefined4 uVar29;
  float fVar30;
  ImRect overlay_rect;
  ImDrawList *overlay_draw_lists [2];
  ImRect local_118;
  undefined1 local_108 [8];
  ImVec2 IStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  ulong local_d0;
  ImGuiContext *local_c8;
  ImGuiWindow *local_c0;
  ImGuiWindow *local_b8;
  ImGuiDockPreviewData *local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  undefined1 local_98 [16];
  ImGuiDockNode *local_80;
  long local_78;
  ImU32 local_70;
  ImU32 local_6c;
  ImDrawList *local_68 [2];
  ImGuiTabBar *local_58;
  ImGuiDockNode *local_50;
  undefined1 local_48 [16];
  
  pIVar17 = GImGui;
  local_b0 = data;
  if (GImGui->CurrentWindow != host_window) {
    __assert_fail("g.CurrentWindow == host_window",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x39da,
                  "void ImGui::DockNodePreviewDockRender(ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, const ImGuiDockPreviewData *)"
                 );
  }
  bVar27 = (GImGui->IO).ConfigDockingTransparentPayload;
  lVar22 = 1;
  local_68[0] = GetViewportDrawList(host_window->Viewport,1,"##Foreground");
  local_c0 = host_window;
  if (host_window->Viewport != root_payload->Viewport && (bVar27 & 1U) == 0) {
    local_68[1] = GetViewportDrawList(root_payload->Viewport,1,"##Foreground");
    lVar22 = 2;
  }
  pIVar13 = GImGui;
  local_c8 = pIVar17;
  fVar28 = 0.6;
  bVar27 = (bVar27 & 1U) != 0;
  if (!bVar27) {
    fVar28 = 0.4;
  }
  local_108 = *(undefined1 (*) [8])((GImGui->Style).Colors + 0x26);
  uVar5 = (GImGui->Style).Colors[0x26].z;
  uVar6 = (GImGui->Style).Colors[0x26].w;
  local_f8._0_4_ = (GImGui->Style).Alpha;
  IStack_100.y = fVar28 * (float)local_f8._0_4_ * (float)uVar6;
  IStack_100.x = (float)uVar5;
  if (bVar27) {
    uVar29 = 0x3f666666;
  }
  else {
    uVar29 = 0x3f333333;
  }
  local_d0 = CONCAT44(local_d0._4_4_,uVar29);
  if (bVar27) {
    local_e8._0_4_ = 0x3f99999a;
  }
  else {
    local_e8._0_4_ = 0x3f800000;
  }
  if (bVar27) {
    local_98._0_4_ = 0x3f4ccccd;
  }
  else {
    local_98._0_4_ = 0x3f19999a;
  }
  local_78 = lVar22;
  IVar14 = ColorConvertFloat4ToU32((ImVec4 *)local_108);
  local_108 = *(undefined1 (*) [8])((pIVar13->Style).Colors + 0x26);
  uVar7 = (pIVar13->Style).Colors[0x26].z;
  uVar8 = (pIVar13->Style).Colors[0x26].w;
  IStack_100.y = (float)local_d0 * (float)local_f8._0_4_ * (float)uVar8;
  IStack_100.x = (float)uVar7;
  local_6c = ColorConvertFloat4ToU32((ImVec4 *)local_108);
  local_108 = *(undefined1 (*) [8])((pIVar13->Style).Colors + 0x26);
  uVar9 = (pIVar13->Style).Colors[0x26].z;
  uVar10 = (pIVar13->Style).Colors[0x26].w;
  IStack_100.y = (float)local_e8._0_4_ * (float)local_f8._0_4_ * (float)uVar10;
  IStack_100.x = (float)uVar9;
  local_70 = ColorConvertFloat4ToU32((ImVec4 *)local_108);
  local_108 = *(undefined1 (*) [8])((pIVar13->Style).Colors + 0x34);
  uVar11 = (pIVar13->Style).Colors[0x34].z;
  uVar12 = (pIVar13->Style).Colors[0x34].w;
  IStack_100.y = (float)local_98._0_4_ * (float)local_f8._0_4_ * (float)uVar12;
  IStack_100.x = (float)uVar11;
  col = ColorConvertFloat4ToU32((ImVec4 *)local_108);
  lVar22 = local_78;
  pIVar19 = local_c0;
  if (root_payload->DockNodeAsHost == (ImGuiDockNode *)0x0) {
    uVar21 = 0;
  }
  else {
    uVar21 = CONCAT71((int7)((ulong)extraout_RDX >> 8),
                      (root_payload->DockNodeAsHost->Windows).Size < 1);
  }
  pIVar25 = local_b0;
  local_80 = host_node;
  if (local_b0->IsDropAllowed != true) goto LAB_001444bf;
  pIVar15 = &(local_b0->FutureNode).Pos;
  fVar28 = pIVar15->x;
  fVar30 = (local_b0->FutureNode).Pos.y;
  local_108 = *(undefined1 (*) [8])pIVar15;
  IVar3 = (local_b0->FutureNode).Size;
  IStack_100.y = IVar3.y + fVar30;
  IStack_100.x = IVar3.x + fVar28;
  if (local_b0->SplitDir == -1 && (uVar21 & 1) == 0) {
    fVar2 = (pIVar13->Style).FramePadding.y;
    local_108._4_4_ = fVar30 + fVar2 + fVar2 + pIVar13->FontSize;
    local_108._0_4_ = fVar28;
LAB_0014409a:
    if (local_b0->IsCenterAvailable == true) goto LAB_001440a4;
  }
  else {
    if (local_b0->SplitDir == -1) goto LAB_0014409a;
LAB_001440a4:
    local_f8._0_4_ = (int)uVar21;
    lVar23 = 0;
    local_b8 = root_payload;
    do {
      ImDrawList::AddRectFilled
                (local_68[lVar23],(ImVec2 *)local_108,&IStack_100,IVar14,pIVar19->WindowRounding,0);
      lVar23 = lVar23 + 1;
    } while (lVar22 != lVar23);
    uVar21 = (ulong)(byte)(local_b0->IsDropAllowed ^ 1U | local_f8[0]);
    root_payload = local_b8;
  }
  host_node = local_80;
  pIVar25 = local_b0;
  if ((((uVar21 & 1) != 0) || (local_b0->SplitDir != -1)) || (local_b0->IsCenterAvailable != true))
  goto LAB_001444bf;
  local_108._0_4_ = 0.0;
  local_108._4_4_ = 0.0;
  IStack_100.x = 0.0;
  IStack_100.y = 0.0;
  DockNodeCalcTabBarLayout
            (&local_b0->FutureNode,(ImRect *)0x0,(ImRect *)local_108,(ImVec2 *)0x0,(ImVec2 *)0x0);
  local_e8 = ZEXT416((uint)local_108._0_4_);
  local_48 = ZEXT416((uint)local_108._4_4_);
  if ((host_node == (ImGuiDockNode *)0x0) || (host_node->TabBar == (ImGuiTabBar *)0x0)) {
    if ((local_c0->Flags & 0x20000000) == 0) {
      local_f8._0_4_ = (local_c8->Style).ItemInnerSpacing.x;
      pcVar18 = local_c0->Name;
      bVar27 = local_c0->HasCloseButton;
      goto LAB_001441dd;
    }
  }
  else {
    if ((host_node->MergedFlags & 0x3000) == 0) {
      fVar28 = host_node->TabBar->WidthAllTabs + (local_c8->Style).ItemInnerSpacing.x;
    }
    else {
      if ((host_node->Windows).Size < 1) {
        pcVar18 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
LAB_00144772:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                      ,0x706,pcVar18);
      }
      local_f8._0_4_ = (local_c8->Style).ItemInnerSpacing.x;
      pIVar19 = *(host_node->Windows).Data;
      pcVar18 = pIVar19->Name;
      bVar27 = pIVar19->HasCloseButton;
LAB_001441dd:
      IVar3 = TabItemCalcSize(pcVar18,bVar27);
      fVar28 = IVar3.x + (float)local_f8._0_4_;
    }
    local_e8._0_4_ = (float)local_e8._0_4_ + fVar28;
  }
  pIVar20 = root_payload->DockNodeAsHost;
  if (pIVar20 == (ImGuiDockNode *)0x0) {
    uVar16 = 1;
    pIVar26 = (ImGuiTabBar *)0x0;
  }
  else {
    pIVar26 = pIVar20->TabBar;
    uVar16 = (pIVar26->Tabs).Size;
    if ((int)uVar16 < (pIVar20->Windows).Size) {
      __assert_fail("root_payload->DockNodeAsHost->Windows.Size <= root_payload->DockNodeAsHost->TabBar->Tabs.Size"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x3a0e,
                    "void ImGui::DockNodePreviewDockRender(ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, const ImGuiDockPreviewData *)"
                   );
    }
    if ((int)uVar16 < 1) goto LAB_001444bf;
  }
  local_d0 = (ulong)uVar16;
  uVar21 = 0;
  local_50 = pIVar20;
  local_58 = pIVar26;
  local_b8 = root_payload;
  do {
    pIVar19 = local_b8;
    if (pIVar20 == (ImGuiDockNode *)0x0) {
LAB_0014427e:
      local_98._0_8_ = uVar21;
      bVar27 = DockNodeIsDropAllowedOne(pIVar19,local_c0);
      if (bVar27) {
        IVar3 = TabItemCalcSize(pIVar19->Name,pIVar19->HasCloseButton);
        local_118.Min.y = (float)local_48._0_4_;
        local_118.Min.x = (float)local_e8._0_4_;
        local_118.Max.y = (float)local_48._0_4_ + IVar3.y;
        local_118.Max.x = (float)local_e8._0_4_ + IVar3.x;
        uVar16 = (pIVar19->DockStyle).Colors[0];
        fVar28 = (GImGui->Style).Alpha;
        if (1.0 <= fVar28) {
          local_f8._0_4_ = (pIVar19->DockStyle).Colors[3];
        }
        else {
          uVar4 = (pIVar19->DockStyle).Colors[3];
          uVar16 = (int)(long)((float)(uVar16 >> 0x18) * fVar28) << 0x18 | uVar16 & 0xffffff;
          local_f8._0_4_ = (int)(long)((float)(uVar4 >> 0x18) * fVar28) << 0x18 | uVar4 & 0xffffff;
        }
        local_f8._4_4_ = 0;
        local_e8._0_4_ = (float)local_e8._0_4_ + IVar3.x + (local_c8->Style).ItemInnerSpacing.x;
        PushStyleColor(0,uVar16);
        lVar22 = 0;
        do {
          uVar16 = pIVar19->Flags;
          if (local_118.Min.x < (float)local_108._0_4_) {
LAB_001443a2:
            pIVar24 = local_68[lVar22];
            ImDrawList::PushClipRect(pIVar24,(ImVec2)local_108,IStack_100,false);
          }
          else {
            if (local_118.Min.y < (float)local_108._4_4_) goto LAB_001443a2;
            if (IStack_100.x < local_118.Max.x) goto LAB_001443a2;
            if (IStack_100.y < local_118.Max.y) goto LAB_001443a2;
            pIVar24 = local_68[lVar22];
          }
          uVar16 = uVar16 >> 0x14 & 1 | 0x800000;
          TabItemBackground(pIVar24,&local_118,uVar16,local_f8._0_4_);
          TabItemLabelAndCloseButton
                    (pIVar24,&local_118,uVar16,(local_c8->Style).FramePadding,pIVar19->Name,0,0,
                     false,(bool *)0x0,(bool *)0x0);
          if (local_118.Min.x < (float)local_108._0_4_) {
LAB_0014444f:
            ImDrawList::PopClipRect(pIVar24);
          }
          else {
            if (local_118.Min.y < (float)local_108._4_4_) goto LAB_0014444f;
            if (IStack_100.x < local_118.Max.x) goto LAB_0014444f;
            if (IStack_100.y < local_118.Max.y) goto LAB_0014444f;
          }
          lVar22 = lVar22 + 1;
        } while (local_78 != lVar22);
        PopStyleColor(1);
        pIVar20 = local_50;
        host_node = local_80;
        pIVar25 = local_b0;
        pIVar26 = local_58;
      }
      uVar21 = local_98._0_8_;
    }
    else {
      if ((long)(pIVar26->Tabs).Size <= (long)uVar21) {
        pcVar18 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
        goto LAB_00144772;
      }
      pIVar19 = (pIVar26->Tabs).Data[uVar21].Window;
      if (pIVar19 != (ImGuiWindow *)0x0) goto LAB_0014427e;
    }
    uVar21 = uVar21 + 1;
  } while (uVar21 != local_d0);
LAB_001444bf:
  fVar28 = (local_c8->Style).FrameRounding;
  fVar30 = 3.0;
  if (3.0 <= fVar28) {
    fVar30 = fVar28;
  }
  local_c0 = (ImGuiWindow *)CONCAT44(local_c0._4_4_,fVar30);
  pIVar19 = (ImGuiWindow *)pIVar25->DropRectsDraw;
  uVar21 = 0xffffffffffffffff;
  pIVar17 = local_c8;
  local_b8 = pIVar19;
  while( true ) {
    if (uVar21 == 4) {
      return;
    }
    local_d0 = uVar21 + 1;
    fVar28 = (((ImRect *)((long)pIVar19 + local_d0 * 0x10))->Min).x;
    if ((fVar28 < (((ImRect *)((long)pIVar19 + local_d0 * 0x10))->Max).x ||
         fVar28 == (((ImRect *)((long)pIVar19 + local_d0 * 0x10))->Max).x) &&
       (fVar28 = (((ImRect *)((long)pIVar19 + local_d0 * 0x10))->Min).y,
       pfVar1 = &(((ImRect *)((long)pIVar19 + local_d0 * 0x10))->Max).y,
       fVar28 < *pfVar1 || fVar28 == *pfVar1)) {
      pIVar15 = (ImVec2 *)((long)pIVar19 + local_d0 * 0x10);
      local_108 = *(undefined1 (*) [8])pIVar15;
      IStack_100 = pIVar15[1];
      local_118.Min.x = (*pIVar15).x;
      local_118.Min.y = (*pIVar15).y;
      local_118.Max.x = pIVar15[1].x;
      local_118.Max.y = pIVar15[1].y;
      local_118.Min.x = local_118.Min.x + 2.0;
      local_118.Min.y = local_118.Min.y + 2.0;
      local_118.Max.x = local_118.Max.x + -2.0;
      local_118.Max.y = local_118.Max.y + -2.0;
      if ((pIVar25->SplitDir != (uint)uVar21) ||
         (IVar14 = local_70, pIVar25->IsSplitDirExplicit == false)) {
        IVar14 = local_6c;
      }
      lVar22 = 0;
      do {
        local_e8._0_4_ = local_118.Max.x;
        local_98 = ZEXT416((uint)local_118.Min.x);
        local_f8 = ZEXT416((uint)(local_118.Min.y + local_118.Max.y));
        pIVar24 = local_68[lVar22];
        ImDrawList::AddRectFilled(pIVar24,(ImVec2 *)local_108,&IStack_100,IVar14,local_c0._0_4_,0);
        ImDrawList::AddRect(pIVar24,&local_118.Min,&local_118.Max,col,local_c0._0_4_,0,1.0);
        local_f8._0_4_ = (float)local_f8._0_4_ * 0.5;
        if (uVar21 < 2) {
          local_a8.x = (float)(int)(((float)local_98._0_4_ + (float)local_e8._0_4_) * 0.5);
          local_a0.y = local_118.Min.y;
          local_a8.y = local_118.Max.y;
          local_a0.x = local_a8.x;
          ImDrawList::AddLine(pIVar24,&local_a0,&local_a8,col,1.0);
        }
        if (((uint)uVar21 & 0xfffffffe) == 2) {
          local_a8.y = (float)(int)(float)local_f8._0_4_;
          local_a0.x = local_118.Min.x;
          local_a8.x = local_118.Max.x;
          local_a0.y = local_a8.y;
          ImDrawList::AddLine(pIVar24,&local_a0,&local_a8,col,1.0);
        }
        lVar22 = lVar22 + 1;
        pIVar17 = local_c8;
        pIVar19 = local_b8;
        host_node = local_80;
        pIVar25 = local_b0;
      } while (local_78 != lVar22);
    }
    uVar21 = local_d0;
    if ((host_node != (ImGuiDockNode *)0x0) && ((host_node->MergedFlags & 0x10) != 0)) break;
    if ((pIVar17->IO).ConfigDockingNoSplit == true) {
      return;
    }
  }
  return;
}

Assistant:

static void ImGui::DockNodePreviewDockRender(ImGuiWindow* host_window, ImGuiDockNode* host_node, ImGuiWindow* root_payload, const ImGuiDockPreviewData* data)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.CurrentWindow == host_window);   // Because we rely on font size to calculate tab sizes

    // With this option, we only display the preview on the target viewport, and the payload viewport is made transparent.
    // To compensate for the single layer obstructed by the payload, we'll increase the alpha of the preview nodes.
    const bool is_transparent_payload = g.IO.ConfigDockingTransparentPayload;

    // In case the two windows involved are on different viewports, we will draw the overlay on each of them.
    int overlay_draw_lists_count = 0;
    ImDrawList* overlay_draw_lists[2];
    overlay_draw_lists[overlay_draw_lists_count++] = GetForegroundDrawList(host_window->Viewport);
    if (host_window->Viewport != root_payload->Viewport && !is_transparent_payload)
        overlay_draw_lists[overlay_draw_lists_count++] = GetForegroundDrawList(root_payload->Viewport);

    // Draw main preview rectangle
    const ImU32 overlay_col_main = GetColorU32(ImGuiCol_DockingPreview, is_transparent_payload ? 0.60f : 0.40f);
    const ImU32 overlay_col_drop = GetColorU32(ImGuiCol_DockingPreview, is_transparent_payload ? 0.90f : 0.70f);
    const ImU32 overlay_col_drop_hovered = GetColorU32(ImGuiCol_DockingPreview, is_transparent_payload ? 1.20f : 1.00f);
    const ImU32 overlay_col_lines = GetColorU32(ImGuiCol_NavWindowingHighlight, is_transparent_payload ? 0.80f : 0.60f);

    // Display area preview
    const bool can_preview_tabs = (root_payload->DockNodeAsHost == NULL || root_payload->DockNodeAsHost->Windows.Size > 0);
    if (data->IsDropAllowed)
    {
        ImRect overlay_rect = data->FutureNode.Rect();
        if (data->SplitDir == ImGuiDir_None && can_preview_tabs)
            overlay_rect.Min.y += GetFrameHeight();
        if (data->SplitDir != ImGuiDir_None || data->IsCenterAvailable)
            for (int overlay_n = 0; overlay_n < overlay_draw_lists_count; overlay_n++)
                overlay_draw_lists[overlay_n]->AddRectFilled(overlay_rect.Min, overlay_rect.Max, overlay_col_main, host_window->WindowRounding);
    }

    // Display tab shape/label preview unless we are splitting node (it generally makes the situation harder to read)
    if (data->IsDropAllowed && can_preview_tabs && data->SplitDir == ImGuiDir_None && data->IsCenterAvailable)
    {
        // Compute target tab bar geometry so we can locate our preview tabs
        ImRect tab_bar_rect;
        DockNodeCalcTabBarLayout(&data->FutureNode, NULL, &tab_bar_rect, NULL, NULL);
        ImVec2 tab_pos = tab_bar_rect.Min;
        if (host_node && host_node->TabBar)
        {
            if (!host_node->IsHiddenTabBar() && !host_node->IsNoTabBar())
                tab_pos.x += host_node->TabBar->WidthAllTabs + g.Style.ItemInnerSpacing.x; // We don't use OffsetNewTab because when using non-persistent-order tab bar it is incremented with each Tab submission.
            else
                tab_pos.x += g.Style.ItemInnerSpacing.x + TabItemCalcSize(host_node->Windows[0]->Name, host_node->Windows[0]->HasCloseButton).x;
        }
        else if (!(host_window->Flags & ImGuiWindowFlags_DockNodeHost))
        {
            tab_pos.x += g.Style.ItemInnerSpacing.x + TabItemCalcSize(host_window->Name, host_window->HasCloseButton).x; // Account for slight offset which will be added when changing from title bar to tab bar
        }

        // Draw tab shape/label preview (payload may be a loose window or a host window carrying multiple tabbed windows)
        if (root_payload->DockNodeAsHost)
            IM_ASSERT(root_payload->DockNodeAsHost->Windows.Size <= root_payload->DockNodeAsHost->TabBar->Tabs.Size);
        ImGuiTabBar* tab_bar_with_payload = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->TabBar : NULL;
        const int payload_count = tab_bar_with_payload ? tab_bar_with_payload->Tabs.Size : 1;
        for (int payload_n = 0; payload_n < payload_count; payload_n++)
        {
            // DockNode's TabBar may have non-window Tabs manually appended by user
            ImGuiWindow* payload_window = tab_bar_with_payload ? tab_bar_with_payload->Tabs[payload_n].Window : root_payload;
            if (tab_bar_with_payload && payload_window == NULL)
                continue;
            if (!DockNodeIsDropAllowedOne(payload_window, host_window))
                continue;

            // Calculate the tab bounding box for each payload window
            ImVec2 tab_size = TabItemCalcSize(payload_window->Name, payload_window->HasCloseButton);
            ImRect tab_bb(tab_pos.x, tab_pos.y, tab_pos.x + tab_size.x, tab_pos.y + tab_size.y);
            tab_pos.x += tab_size.x + g.Style.ItemInnerSpacing.x;
            const ImU32 overlay_col_text = GetColorU32(payload_window->DockStyle.Colors[ImGuiWindowDockStyleCol_Text]);
            const ImU32 overlay_col_tabs = GetColorU32(payload_window->DockStyle.Colors[ImGuiWindowDockStyleCol_TabActive]);
            PushStyleColor(ImGuiCol_Text, overlay_col_text);
            for (int overlay_n = 0; overlay_n < overlay_draw_lists_count; overlay_n++)
            {
                ImGuiTabItemFlags tab_flags = ImGuiTabItemFlags_Preview | ((payload_window->Flags & ImGuiWindowFlags_UnsavedDocument) ? ImGuiTabItemFlags_UnsavedDocument : 0);
                if (!tab_bar_rect.Contains(tab_bb))
                    overlay_draw_lists[overlay_n]->PushClipRect(tab_bar_rect.Min, tab_bar_rect.Max);
                TabItemBackground(overlay_draw_lists[overlay_n], tab_bb, tab_flags, overlay_col_tabs);
                TabItemLabelAndCloseButton(overlay_draw_lists[overlay_n], tab_bb, tab_flags, g.Style.FramePadding, payload_window->Name, 0, 0, false, NULL, NULL);
                if (!tab_bar_rect.Contains(tab_bb))
                    overlay_draw_lists[overlay_n]->PopClipRect();
            }
            PopStyleColor();
        }
    }

    // Display drop boxes
    const float overlay_rounding = ImMax(3.0f, g.Style.FrameRounding);
    for (int dir = ImGuiDir_None; dir < ImGuiDir_COUNT; dir++)
    {
        if (!data->DropRectsDraw[dir + 1].IsInverted())
        {
            ImRect draw_r = data->DropRectsDraw[dir + 1];
            ImRect draw_r_in = draw_r;
            draw_r_in.Expand(-2.0f);
            ImU32 overlay_col = (data->SplitDir == (ImGuiDir)dir && data->IsSplitDirExplicit) ? overlay_col_drop_hovered : overlay_col_drop;
            for (int overlay_n = 0; overlay_n < overlay_draw_lists_count; overlay_n++)
            {
                ImVec2 center = ImFloor(draw_r_in.GetCenter());
                overlay_draw_lists[overlay_n]->AddRectFilled(draw_r.Min, draw_r.Max, overlay_col, overlay_rounding);
                overlay_draw_lists[overlay_n]->AddRect(draw_r_in.Min, draw_r_in.Max, overlay_col_lines, overlay_rounding);
                if (dir == ImGuiDir_Left || dir == ImGuiDir_Right)
                    overlay_draw_lists[overlay_n]->AddLine(ImVec2(center.x, draw_r_in.Min.y), ImVec2(center.x, draw_r_in.Max.y), overlay_col_lines);
                if (dir == ImGuiDir_Up || dir == ImGuiDir_Down)
                    overlay_draw_lists[overlay_n]->AddLine(ImVec2(draw_r_in.Min.x, center.y), ImVec2(draw_r_in.Max.x, center.y), overlay_col_lines);
            }
        }

        // Stop after ImGuiDir_None
        if ((host_node && (host_node->MergedFlags & ImGuiDockNodeFlags_NoSplit)) || g.IO.ConfigDockingNoSplit)
            return;
    }
}